

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckySimple.c
# Opt level: O0

int oneBitPosition(int x,int size)

{
  int local_18;
  int i;
  int size_local;
  int x_local;
  
  local_18 = 0;
  while( true ) {
    if (size <= local_18) {
      return -1;
    }
    if ((x >> ((byte)local_18 & 0x1f) & 1U) != 0) break;
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

int oneBitPosition(int x, int size)
{
	int i;
	for(i=0;i<size;i++)
		if((x>>i)&1)
			return i;
	return -1;
}